

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiWindow::~ImGuiWindow(ImGuiWindow *this)

{
  long in_RDI;
  int i;
  ImGuiWindowTempData *in_stack_ffffffffffffffe0;
  undefined4 local_c;
  
  IM_DELETE<char>((char *)0x12edfb);
  for (local_c = 0; local_c != *(int *)(in_RDI + 0x2a0); local_c = local_c + 1) {
    in_stack_ffffffffffffffe0 =
         (ImGuiWindowTempData *)
         ImVector<ImGuiOldColumns>::operator[]
                   ((ImVector<ImGuiOldColumns> *)(in_RDI + 0x2a0),local_c);
    ImGuiOldColumns::~ImGuiOldColumns((ImGuiOldColumns *)in_stack_ffffffffffffffe0);
  }
  ImDrawList::~ImDrawList((ImDrawList *)in_stack_ffffffffffffffe0);
  ImVector<ImGuiOldColumns>::~ImVector((ImVector<ImGuiOldColumns> *)in_stack_ffffffffffffffe0);
  ImGuiStorage::~ImGuiStorage((ImGuiStorage *)0x12ee7c);
  ImGuiWindowTempData::~ImGuiWindowTempData(in_stack_ffffffffffffffe0);
  ImVector<unsigned_int>::~ImVector((ImVector<unsigned_int> *)in_stack_ffffffffffffffe0);
  return;
}

Assistant:

ImGuiWindow::~ImGuiWindow()
{
    IM_ASSERT(DrawList == &DrawListInst);
    IM_DELETE(Name);
    for (int i = 0; i != ColumnsStorage.Size; i++)
        ColumnsStorage[i].~ImGuiOldColumns();
}